

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-direct-master.cpp
# Opt level: O3

void __thiscall Block::show_link(Block *this,ProxyWithLink *cp)

{
  Link *pLVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  char local_31 [9];
  
  pLVar1 = cp->link_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Block (",7);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(cp->super_Proxy).gid_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"): ",3);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar4,
                      (pLVar1[3].neighbors_.
                       super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage)->gid);
  local_31[0] = ' ';
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_31,1);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar4,
                      (pLVar1[3].neighbors_.
                       super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage)->proc);
  local_31[1] = 0x20;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_31 + 1,1);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar4,
                      pLVar1[3].neighbors_.
                      super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage[1].gid);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," - ",3);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar4,
                      (pLVar1[5].neighbors_.
                       super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage)->gid);
  local_31[2] = 0x20;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_31 + 2,1);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar4,
                      (pLVar1[5].neighbors_.
                       super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage)->proc);
  local_31[3] = 0x20;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_31 + 3,1);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar4,
                      pLVar1[5].neighbors_.
                      super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage[1].gid);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," : ",3);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar4,
                      (pLVar1[7].neighbors_.
                       super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage)->gid);
  local_31[4] = 0x20;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_31 + 4,1);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar4,
                      (pLVar1[7].neighbors_.
                       super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage)->proc);
  local_31[5] = 0x20;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_31 + 5,1);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar4,
                      pLVar1[7].neighbors_.
                      super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage[1].gid);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," - ",3);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar4,
                      (pLVar1[9].neighbors_.
                       super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage)->gid);
  local_31[6] = 0x20;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_31 + 6,1);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar4,
                      (pLVar1[9].neighbors_.
                       super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage)->proc);
  local_31[7] = 0x20;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_31 + 7,1);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar4,
                      pLVar1[9].neighbors_.
                      super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage[1].gid);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," : ",3);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar4,
                      (int)((ulong)((long)(pLVar1->neighbors_).
                                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pLVar1->neighbors_).
                                         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3));
  local_31[8] = 0x20;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_31 + 8,1);
  lVar2 = *(long *)poVar4;
  lVar3 = *(long *)(lVar2 + -0x18);
  *(uint *)(poVar4 + lVar3 + 0x18) = *(uint *)(poVar4 + lVar3 + 0x18) & 0xffffffb5 | 2;
  std::ios::widen((char)*(undefined8 *)(lVar2 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return;
}

Assistant:

void show_link(const diy::Master::ProxyWithLink& cp)
    {
      diy::RegularLink<Bounds>* link = static_cast<diy::RegularLink<Bounds>*>(cp.link());
      std::cout << "Block (" << cp.gid() << "): "
                << link->core().min[0]   << ' ' << link->core().min[1]   << ' ' << link->core().min[2] << " - "
                << link->core().max[0]   << ' ' << link->core().max[1]   << ' ' << link->core().max[2] << " : "
                << link->bounds().min[0] << ' ' << link->bounds().min[1] << ' ' << link->bounds().min[2] << " - "
                << link->bounds().max[0] << ' ' << link->bounds().max[1] << ' ' << link->bounds().max[2] << " : "
                << link->size()   << ' ' //<< std::endl
                << std::dec
                << std::endl;
    }